

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.hpp
# Opt level: O1

void jsonip::parser::decode_string(string *data)

{
  pointer pcVar1;
  ulong uVar2;
  size_type *local_48;
  string buffer;
  
  uVar2 = std::__cxx11::string::find((char)data,0x5c);
  if (uVar2 != 0xffffffffffffffff) {
    buffer._M_dataplus._M_p = (pointer)0x0;
    buffer._M_string_length._0_1_ = 0;
    local_48 = &buffer._M_string_length;
    std::__cxx11::string::reserve((ulong)&local_48);
    if (uVar2 != 0) {
      std::__cxx11::string::append((char *)&local_48,(ulong)(data->_M_dataplus)._M_p);
    }
    if (uVar2 < data->_M_string_length) {
      do {
        pcVar1 = (data->_M_dataplus)._M_p;
        if (pcVar1[uVar2] == '\\') {
          std::__cxx11::string::append((char *)&local_48,(ulong)(pcVar1 + uVar2 + 1));
          uVar2 = uVar2 + 1;
        }
        else {
          std::__cxx11::string::append((char *)&local_48,(ulong)(pcVar1 + uVar2));
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < data->_M_string_length);
    }
    std::__cxx11::string::swap((string *)data);
    if (local_48 != &buffer._M_string_length) {
      operator_delete(local_48,CONCAT71(buffer._M_string_length._1_7_,
                                        (undefined1)buffer._M_string_length) + 1);
    }
  }
  return;
}

Assistant:

inline void decode_string(std::string& data)
    {
        // Fast check for the most common case. No copy.
        size_t pos;
        if (std::string::npos == (pos = data.find('\\'))) return;

        std::string buffer;
        buffer.reserve(data.size());
        // Copy the first part, if it exists
        if (pos) buffer.append(&data[0], pos);
        for (; pos < data.size(); ++pos)  // NOTE: '<' instead of '!='.
        {
            switch (data[pos])
            {
                // NOTE: Do not check for malformed input
                case '\\':
                    buffer.append(&data[++pos], 1);
                    break;
                default:
                    buffer.append(&data[pos], 1);
                    break;
            }
        }
        data.swap(buffer);
    }